

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArrayAccessExpression *expression)

{
  int index_00;
  Value *pVVar1;
  ArrayValue *local_a0;
  string local_60;
  Symbol local_40;
  int local_20;
  int local_1c;
  int index;
  int array_index;
  ArrayAccessExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  _index = expression;
  expression_local = (ArrayAccessExpression *)this;
  pVVar1 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,
                      &expression->index_expression_->super_Node);
  local_1c = (*pVVar1->_vptr_Value[2])();
  std::__cxx11::string::string((string *)&local_60,(string *)&_index->array_indent_);
  Symbol::Symbol(&local_40,&local_60);
  index_00 = FunctionTable::Get(&this->table_,&local_40);
  Symbol::~Symbol(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_20 = index_00;
  pVVar1 = FrameEmulator::Get(&this->frame_,index_00);
  if (pVVar1 == (Value *)0x0) {
    local_a0 = (ArrayValue *)0x0;
  }
  else {
    local_a0 = (ArrayValue *)__dynamic_cast(pVVar1,&Value::typeinfo,&ArrayValue::typeinfo,0);
  }
  pVVar1 = ArrayValue::AtIndex(local_a0,(long)local_1c);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar1;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArrayAccessExpression* expression) {
  int array_index = Accept(expression->index_expression_)->GetValue();
  int index = table_.Get(Symbol(expression->array_indent_));
  tos_value_ =
      dynamic_cast<ArrayValue*>(frame_.Get(index))->AtIndex(array_index);
}